

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_FabArrayBase.cpp
# Opt level: O2

void __thiscall amrex::FabArrayBase::~FabArrayBase(FabArrayBase *this)

{
  this->_vptr_FabArrayBase = (_func_int **)&PTR__FabArrayBase_006da0d8;
  std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base
            (&(this->ownership).super__Bvector_base<std::allocator<bool>_>);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&this->indexArray);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->distributionMap).m_ref.
              super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  BoxArray::~BoxArray(&this->boxarray);
  return;
}

Assistant:

FabArrayBase::~FabArrayBase () {}